

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O2

int secp256k1_ec_privkey_tweak_mul(secp256k1_context *ctx,uchar *seckey,uchar *tweak)

{
  undefined4 extraout_EAX;
  int iVar1;
  int iVar2;
  undefined1 auVar3 [16];
  int overflow;
  secp256k1_scalar local_58;
  secp256k1_scalar local_38;
  
  overflow = 0;
  secp256k1_scalar_set_b32(&local_58,tweak,&overflow);
  iVar2 = 0;
  secp256k1_scalar_set_b32(&local_38,seckey,(int *)0x0);
  if ((overflow == 0) &&
     (auVar3._0_4_ = -(uint)((int)local_58.d[2] == 0 && (int)local_58.d[0] == 0),
     auVar3._4_4_ = -(uint)(local_58.d[2]._4_4_ == 0 && local_58.d[0]._4_4_ == 0),
     auVar3._8_4_ = -(uint)((int)local_58.d[3] == 0 && (int)local_58.d[1] == 0),
     auVar3._12_4_ = -(uint)(local_58.d[3]._4_4_ == 0 && local_58.d[1]._4_4_ == 0),
     iVar1 = movmskps(extraout_EAX,auVar3), iVar1 != 0xf)) {
    secp256k1_scalar_mul(&local_38,&local_38,&local_58);
    *(undefined1 (*) [16])(seckey + 0x10) = (undefined1  [16])0x0;
    seckey[0] = '\0';
    seckey[1] = '\0';
    seckey[2] = '\0';
    seckey[3] = '\0';
    seckey[4] = '\0';
    seckey[5] = '\0';
    seckey[6] = '\0';
    seckey[7] = '\0';
    seckey[8] = '\0';
    seckey[9] = '\0';
    seckey[10] = '\0';
    seckey[0xb] = '\0';
    seckey[0xc] = '\0';
    seckey[0xd] = '\0';
    seckey[0xe] = '\0';
    seckey[0xf] = '\0';
    secp256k1_scalar_get_b32(seckey,&local_38);
    iVar2 = 1;
  }
  else {
    *(undefined1 (*) [16])(seckey + 0x10) = (undefined1  [16])0x0;
    seckey[0] = '\0';
    seckey[1] = '\0';
    seckey[2] = '\0';
    seckey[3] = '\0';
    seckey[4] = '\0';
    seckey[5] = '\0';
    seckey[6] = '\0';
    seckey[7] = '\0';
    seckey[8] = '\0';
    seckey[9] = '\0';
    seckey[10] = '\0';
    seckey[0xb] = '\0';
    seckey[0xc] = '\0';
    seckey[0xd] = '\0';
    seckey[0xe] = '\0';
    seckey[0xf] = '\0';
  }
  return iVar2;
}

Assistant:

int secp256k1_ec_privkey_tweak_mul(const secp256k1_context* ctx, unsigned char *seckey, const unsigned char *tweak) {
    secp256k1_scalar factor;
    secp256k1_scalar sec;
    int ret = 0;
    int overflow = 0;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(seckey != NULL);
    ARG_CHECK(tweak != NULL);

    secp256k1_scalar_set_b32(&factor, tweak, &overflow);
    secp256k1_scalar_set_b32(&sec, seckey, NULL);
    ret = !overflow && secp256k1_eckey_privkey_tweak_mul(&sec, &factor);
    memset(seckey, 0, 32);
    if (ret) {
        secp256k1_scalar_get_b32(seckey, &sec);
    }

    secp256k1_scalar_clear(&sec);
    secp256k1_scalar_clear(&factor);
    return ret;
}